

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O2

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_cancel *m)

{
  uint uVar1;
  iterator iVar2;
  ulong uVar3;
  ulong uVar4;
  order_book *this_00;
  undefined1 local_60 [64];
  
  local_60._0_8_ = ZEXT28(m->StockLocate);
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,(key_type *)local_60);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    this_00 = (order_book *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x10);
    uVar1 = m->CanceledShares;
    order_book::cancel(this_00,m->OrderReferenceNumber,
                       (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                              uVar1 << 0x18));
    uVar3 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar4 = (ulong)*(uint6 *)&m->field_0x5;
    uVar3 = ((uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
             (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
            uVar4 << 0x38) >> 0x10;
    *(ulong *)((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x30) = uVar3;
    make_ob_event((event *)local_60,(string *)this_00,uVar3,this_00,0);
    std::function<void_(const_helix::event_&)>::operator()(&this->_process_event,(event *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 8));
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_cancel* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        ob.cancel(m->OrderReferenceNumber, be32toh(m->CanceledShares));
        auto timestamp = itch50_timestamp(m->Timestamp);
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}